

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

LoopInfo * __thiscall
Allocator::construct<LlvmCompilationContext::LoopInfo>(Allocator *this,int count)

{
  int iVar1;
  undefined4 extraout_var;
  LoopInfo *pLVar2;
  
  iVar1 = (*this->_vptr_Allocator[2])();
  if (count != 0) {
    pLVar2 = (LoopInfo *)memset((LoopInfo *)CONCAT44(extraout_var,iVar1),0,(long)count << 4);
    return pLVar2;
  }
  return (LoopInfo *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T* construct(int count)
	{
		void *tmp = (void*)alloc(4 + count * sizeof(T));
		new(tmp) T[count];
		return (T*)tmp;
	}